

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O3

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  double *pdVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  code *pcVar18;
  code *pcVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  bool bVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  double *pdVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  double dVar34;
  double dVar35;
  double local_128;
  undefined1 local_108 [16];
  double local_48;
  
  puVar6 = (uint *)S->content;
  uVar2 = *puVar6;
  uVar26 = (ulong)uVar2;
  uVar3 = puVar6[2];
  uVar4 = puVar6[3];
  puVar7 = *(undefined8 **)(puVar6 + 0x18);
  lVar8 = *(long *)(puVar6 + 0x1a);
  lVar9 = *(long *)(puVar6 + 0x1c);
  lVar10 = *(long *)(puVar6 + 0x1e);
  uVar11 = *(undefined8 *)(puVar6 + 0x20);
  pdVar12 = *(double **)(puVar6 + 0x22);
  uVar13 = *(undefined8 *)(puVar6 + 0x24);
  lVar14 = *(long *)(puVar6 + 0x14);
  lVar15 = *(long *)(puVar6 + 0x16);
  uVar16 = *(undefined8 *)(puVar6 + 0xc);
  uVar17 = *(undefined8 *)(puVar6 + 0x12);
  pcVar18 = *(code **)(puVar6 + 10);
  pcVar19 = *(code **)(puVar6 + 0x10);
  puVar20 = *(undefined8 **)(puVar6 + 0x26);
  puVar21 = *(undefined8 **)(puVar6 + 0x28);
  puVar6[5] = 0;
  uVar5 = puVar6[1];
  if (puVar6[4] == 0) {
    iVar23 = (*pcVar18)(uVar16,x,uVar13);
    if (iVar23 != 0) {
LAB_0012f22c:
      puVar6[4] = 0;
      iVar28 = -0x325;
      iVar24 = 0x323;
LAB_0012f23e:
      if (iVar23 < 0) {
        iVar24 = iVar28;
      }
      goto LAB_0012f8a6;
    }
    N_VLinearSum(0x3ff0000000000000,b,uVar13,uVar13);
  }
  else {
    N_VScale(0x3ff0000000000000,b,uVar13);
  }
  if (lVar14 == 0) {
    N_VScale(0x3ff0000000000000,uVar13,*puVar7);
  }
  else {
    N_VProd(lVar14,uVar13);
  }
  dVar34 = (double)N_VDotProd();
  dVar35 = 0.0;
  if (0.0 < dVar34) {
    if (dVar34 < 0.0) {
      dVar35 = sqrt(dVar34);
    }
    else {
      dVar35 = SQRT(dVar34);
    }
  }
  *(double *)(puVar6 + 6) = dVar35;
  if (dVar35 <= delta) {
LAB_0012f89c:
    puVar6[4] = 0;
    iVar24 = 0;
    goto LAB_0012f8a6;
  }
  N_VConst(0,uVar11);
  if (-1 < (int)uVar4) {
    uVar25 = 0;
    local_108._0_4_ = SUB84(dVar35,0);
    local_108._4_4_ = (undefined4)((ulong)dVar35 >> 0x20);
    local_108._8_4_ = 0;
    local_108._12_4_ = 0;
    uVar31 = 0;
    local_48 = dVar35;
    do {
      if ((int)uVar2 < 0) {
        N_VScale(*puVar7,*puVar7);
        bVar22 = false;
      }
      else {
        uVar29 = 0;
        do {
          if (0 < (int)uVar2) {
            memset(*(void **)(lVar9 + uVar29 * 8),0,uVar26 * 8);
          }
          uVar29 = uVar29 + 1;
        } while (uVar2 + 1 != uVar29);
        N_VScale(1.0 / (double)CONCAT44(local_108._4_4_,local_108._0_4_),*puVar7,*puVar7);
        if ((int)uVar2 < 1) {
          bVar22 = false;
        }
        else {
          bVar22 = true;
          lVar30 = 4;
          local_128 = 1.0;
          uVar29 = 0;
          do {
            puVar6[5] = puVar6[5] + 1;
            if (lVar15 == 0) {
              N_VScale(0x3ff0000000000000,puVar7[uVar29],uVar13);
            }
            else {
              N_VDiv(puVar7[uVar29],lVar15,uVar13);
            }
            if (uVar5 - 1 < 3) {
              N_VScale(0x3ff0000000000000,uVar13,puVar7[uVar29 + 1]);
              iVar23 = (*pcVar19)(delta,uVar17,puVar7[uVar29 + 1],uVar13,2);
              if (iVar23 != 0) {
                puVar6[4] = 0;
                iVar28 = -0x328;
                iVar24 = 0x325;
                goto LAB_0012f23e;
              }
            }
            N_VScale(0x3ff0000000000000,uVar13,*(undefined8 *)(lVar8 + uVar29 * 8));
            iVar23 = (*pcVar18)(uVar16,uVar13,puVar7[uVar29 + 1]);
            if (iVar23 != 0) goto LAB_0012f22c;
            if (lVar14 != 0) {
              N_VProd(lVar14,puVar7[uVar29 + 1]);
            }
            uVar1 = uVar29 + 1;
            lVar33 = *(long *)(lVar9 + 8 + uVar29 * 8) + lVar30 + -4;
            if (uVar3 == 2) {
              SUNClassicalGS(puVar7,lVar9,uVar1 & 0xffffffff,uVar26,lVar33,puVar20,puVar21);
            }
            else {
              SUNModifiedGS(puVar7,lVar9,uVar1 & 0xffffffff,uVar26,lVar33);
            }
            iVar23 = SUNQRfact(uVar1 & 0xffffffff,lVar9,lVar10,uVar29 & 0xffffffff);
            if (iVar23 != 0) {
              puVar6[4] = 0;
              iVar24 = 0x327;
              goto LAB_0012f8a6;
            }
            local_128 = local_128 * *(double *)(lVar10 + lVar30 * 2);
            local_48 = ABS((double)local_108._0_8_ * local_128);
            *(double *)(puVar6 + 6) = local_48;
            if (local_48 <= delta) {
              uVar31 = (ulong)((int)uVar29 + 1);
              break;
            }
            N_VScale(1.0 / *(double *)(*(long *)(lVar9 + 8 + uVar29 * 8) + uVar29 * 8),
                     puVar7[uVar29 + 1],puVar7[uVar29 + 1]);
            bVar22 = (long)uVar1 < (long)(int)uVar2;
            lVar30 = lVar30 + 8;
            uVar29 = uVar1;
            uVar31 = uVar26;
          } while (uVar26 != uVar1);
        }
      }
      *pdVar12 = (double)CONCAT44(local_108._4_4_,local_108._0_4_);
      iVar23 = (int)uVar31;
      if (0 < iVar23) {
        memset(pdVar12 + 1,0,uVar31 * 8);
      }
      iVar24 = SUNQRsol(uVar31,lVar9,lVar10,pdVar12);
      if (iVar24 != 0) {
        puVar6[4] = 0;
        iVar24 = -0x32b;
        goto LAB_0012f8a6;
      }
      *puVar20 = 0x3ff0000000000000;
      *puVar21 = uVar11;
      if (0 < iVar23) {
        uVar29 = 0;
        do {
          puVar20[uVar29 + 1] = pdVar12[uVar29];
          puVar21[uVar29 + 1] = *(undefined8 *)(lVar8 + uVar29 * 8);
          uVar29 = uVar29 + 1;
        } while (uVar31 != uVar29);
      }
      uVar32 = iVar23 + 1;
      N_VLinearCombination();
      if (bVar22) {
        if (puVar6[4] == 0) {
          N_VLinearSum(0x3ff0000000000000,0,x,uVar11,x);
        }
        else {
          N_VScale(uVar11,x);
        }
        goto LAB_0012f89c;
      }
      if (uVar25 == uVar4) goto LAB_0012f83b;
      dVar34 = 1.0;
      if (0 < iVar23) {
        pdVar27 = (double *)(uVar31 * 0x10 + lVar10 + -8);
        uVar29 = uVar31 + 1;
        dVar34 = 1.0;
        do {
          pdVar12[uVar29 - 1] = pdVar27[-1] * dVar34;
          dVar34 = dVar34 * *pdVar27;
          pdVar27 = pdVar27 + -2;
          uVar29 = uVar29 - 1;
        } while (1 < uVar29);
      }
      *pdVar12 = dVar34;
      dVar34 = (double)local_108._0_8_ * dVar34;
      if (iVar23 < 0) {
        uVar29 = local_108._8_8_ & 0x7fffffffffffffff;
        local_108._8_4_ = (int)uVar29;
        local_108._0_8_ = ABS(dVar34);
        local_108._12_4_ = (int)(uVar29 >> 0x20);
      }
      else {
        uVar29 = 0;
        do {
          pdVar12[uVar29] = pdVar12[uVar29] * dVar34;
          uVar29 = uVar29 + 1;
        } while (uVar32 != uVar29);
        uVar29 = local_108._8_8_ & 0x7fffffffffffffff;
        local_108._8_4_ = (int)uVar29;
        local_108._0_8_ = ABS(dVar34);
        local_108._12_4_ = (int)(uVar29 >> 0x20);
        if (-1 < iVar23) {
          uVar29 = 0;
          do {
            puVar20[uVar29] = pdVar12[uVar29];
            puVar21[uVar29] = puVar7[uVar29];
            uVar29 = uVar29 + 1;
          } while (uVar32 != uVar29);
        }
      }
      N_VLinearCombination(uVar32,puVar20,puVar21,*puVar7);
      uVar25 = uVar25 + 1;
    } while( true );
  }
  goto LAB_0012f877;
LAB_0012f83b:
  if (local_48 < dVar35) {
    if (puVar6[4] == 0) {
      N_VLinearSum(0x3ff0000000000000,0,x,uVar11);
    }
    else {
      N_VScale(0x3ff0000000000000,uVar11,x);
    }
    puVar6[4] = 0;
    iVar24 = 0x321;
    goto LAB_0012f8a6;
  }
LAB_0012f877:
  puVar6[4] = 0;
  iVar24 = 0x322;
LAB_0012f8a6:
  *(int *)((long)S->content + 0x20) = iVar24;
  return iVar24;
}

Assistant:

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                          N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  N_Vector *V, *Z, xcor, vtemp, s1, s2;
  sunrealtype **Hes, *givens, *yg, *res_norm;
  sunrealtype beta, rotation_product, r_norm, s_product, rho;
  sunbooleantype preOnRight, scale1, scale2, converged;
  sunbooleantype* zeroguess;
  int i, j, k, l, l_max, krydim, ntries, max_restarts, gstype;
  int* nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  int status;

  /* local shortcuts for fused vector operations */
  sunrealtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  krydim = 0;

  /* Make local shortcuts to solver variables. */
  l_max        = SPFGMR_CONTENT(S)->maxl;
  max_restarts = SPFGMR_CONTENT(S)->max_restarts;
  gstype       = SPFGMR_CONTENT(S)->gstype;
  V            = SPFGMR_CONTENT(S)->V;
  Z            = SPFGMR_CONTENT(S)->Z;
  Hes          = SPFGMR_CONTENT(S)->Hes;
  givens       = SPFGMR_CONTENT(S)->givens;
  xcor         = SPFGMR_CONTENT(S)->xcor;
  yg           = SPFGMR_CONTENT(S)->yg;
  vtemp        = SPFGMR_CONTENT(S)->vtemp;
  s1           = SPFGMR_CONTENT(S)->s1;
  s2           = SPFGMR_CONTENT(S)->s2;
  A_data       = SPFGMR_CONTENT(S)->ATData;
  P_data       = SPFGMR_CONTENT(S)->PData;
  atimes       = SPFGMR_CONTENT(S)->ATimes;
  psolve       = SPFGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPFGMR_CONTENT(S)->zeroguess);
  nli          = &(SPFGMR_CONTENT(S)->numiters);
  res_norm     = &(SPFGMR_CONTENT(S)->resnorm);
  cv           = SPFGMR_CONTENT(S)->cv;
  Xv           = SPFGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* Set sunbooleantype flags for internal solver options */
  preOnRight = ((SPFGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
                (SPFGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPFGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale1     = (s1 != NULL);
  scale2     = (s2 != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!preOnRight || psolve, SUN_ERR_ARG_CORRUPT);

  SUNLogInfo(S->sunctx->logger, "linear-solver", "solver = spfgmr");

  SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, vtemp);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, vtemp);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed matvec, retval = %d", status);

      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
    SUNCheckLastErr();
  }

  /* Apply left scaling to vtemp = r_0 to fill V[0]. */
  if (scale1)
  {
    N_VProd(s1, vtemp, V[0]);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp, V[0]);
    SUNCheckLastErr();
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 r_0, and return if small */
  r_norm = N_VDotProd(V[0], V[0]);
  SUNCheckLastErr();
  *res_norm = r_norm = beta = SUNRsqrt(r_norm);

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;

    SUNLogInfo(S->sunctx->logger,
               "end-linear-iterate", "cur-iter = 0, total-iters = 0, res-norm = %.16g, status = success",
               *res_norm);

    return (LASTFLAG(S));
  }

  SUNLogInfo(S->sunctx->logger,
             "end-linear-iterate", "cur-iter = 0, total-iters = 0, res-norm = %.16g, status = continue",
             *res_norm);

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0. */
  N_VConst(ZERO, xcor);
  SUNCheckLastErr();

  /* Begin outer iterations: up to (max_restarts + 1) attempts. */
  for (ntries = 0; ntries <= max_restarts; ntries++)
  {
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0].             */
    for (i = 0; i <= l_max; i++)
    {
      for (j = 0; j < l_max; j++) { Hes[i][j] = ZERO; }
    }
    rotation_product = ONE;
    N_VScale(ONE / r_norm, V[0], V[0]);
    SUNCheckLastErr();

    /* Inner loop: generate Krylov sequence and Arnoldi basis. */
    for (l = 0; l < l_max; l++)
    {
      SUNLogInfo(S->sunctx->logger, "begin-linear-iterate", "");

      (*nli)++;

      krydim = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 A P_inv s2_inv. */

      /*   Apply right scaling: vtemp = s2_inv V[l]. */
      if (scale2)
      {
        N_VDiv(V[l], s2, vtemp);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, V[l], vtemp);
        SUNCheckLastErr();
      }

      /*   Apply right preconditioner: vtemp = Z[l] = P_inv s2_inv V[l]. */
      if (preOnRight)
      {
        N_VScale(ONE, vtemp, V[l + 1]);
        SUNCheckLastErr();
        status = psolve(P_data, V[l + 1], vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;

          SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                     "status = failed preconditioner solve, retval = %d", status);

          return (LASTFLAG(S));
        }
      }
      N_VScale(ONE, vtemp, Z[l]);
      SUNCheckLastErr();

      /*   Apply A: V[l+1] = A P_inv s2_inv V[l]. */
      status = atimes(A_data, vtemp, V[l + 1]);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                   : SUNLS_ATIMES_FAIL_REC;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed matvec, retval = %d", status);

        return (LASTFLAG(S));
      }

      /*   Apply left scaling: V[l+1] = s1 A P_inv s2_inv V[l]. */
      if (scale1)
      {
        N_VProd(s1, V[l + 1], V[l + 1]);
        SUNCheckLastErr();
      }

      /* Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde. */
      if (gstype == SUN_CLASSICAL_GS)
      {
        SUNCheckCall(
          SUNClassicalGS(V, Hes, l + 1, l_max, &(Hes[l + 1][l]), cv, Xv));
      }
      else
      {
        SUNCheckCall(SUNModifiedGS(V, Hes, l + 1, l_max, &(Hes[l + 1][l])));
      }

      /* Update the QR factorization of Hes. */
      if (SUNQRfact(krydim, Hes, givens, l) != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;

        SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                   "status = failed QR factorization");

        return (LASTFLAG(S));
      }

      /* Update residual norm estimate; break if convergence test passes. */
      rotation_product *= givens[2 * l + 1];
      *res_norm = rho = SUNRabs(rotation_product * r_norm);

      SUNLogInfo(S->sunctx->logger, "linear-iterate",
                 "cur-iter = %i, total-iters = %i, res-norm = %.16g", l + 1,
                 *nli, *res_norm);

      if (rho <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine. */
      N_VScale(ONE / Hes[l + 1][l], V[l + 1], V[l + 1]);
      SUNCheckLastErr();

      SUNLogInfoIf(l < l_max - 1, S->sunctx->logger, "end-linear-iterate",
                   "status = continue");
    }

    /* Inner loop is done.  Compute the new correction vector xcor. */

    /*   Construct g, then solve for y. */
    yg[0] = r_norm;
    for (i = 1; i <= krydim; i++) { yg[i] = ZERO; }
    if (SUNQRsol(krydim, Hes, givens, yg) != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
                 "status = failed QR solve");

      return (LASTFLAG(S));
    }

    /*   Add correction vector Z_l y to xcor. */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k = 0; k < krydim; k++)
    {
      cv[k + 1] = yg[k];
      Xv[k + 1] = Z[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, xcor));

    /* If converged, construct the final solution vector x and return. */
    if (converged)
    {
      if (*zeroguess)
      {
        N_VScale(ONE, xcor, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, ONE, xcor, x);
        SUNCheckLastErr();
      }
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUN_SUCCESS;

      SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = success");

      return (LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart. */
    if (ntries == max_restarts) { break; }

    /* Construct last column of Q in yg. */
    s_product = ONE;
    for (i = krydim; i > 0; i--)
    {
      yg[i] = s_product * givens[2 * i - 2];
      s_product *= givens[2 * i - 1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg. */
    r_norm *= s_product;
    for (i = 0; i <= krydim; i++) { yg[i] *= r_norm; }
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart. */
    for (k = 0; k <= krydim; k++)
    {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, V[0]));

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate", "status = continue");
  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta)
  {
    if (*zeroguess)
    {
      N_VScale(ONE, xcor, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, ONE, xcor, x);
      SUNCheckLastErr();
    }
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;

    SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
               "status = failed residual reduced");

    return (LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;

  SUNLogInfo(S->sunctx->logger, "end-linear-iterate",
             "status = failed max iterations");

  return (LASTFLAG(S));
}